

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

void anon_unknown.dwarf_36ee15::log_stack_error(Node *stack,Attribute *attr)

{
  ostream *poVar1;
  string stackstr;
  string helpstr;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268 [16];
  string local_258;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228 [16];
  Log local_218;
  
  local_278 = local_268;
  local_270 = 0;
  local_238 = local_228;
  local_230 = 0;
  local_268[0] = 0;
  local_228[0] = 0;
  if (stack == (Node *)0x0) {
    std::__cxx11::string::assign((char *)&local_278);
  }
  else {
    std::__cxx11::string::assign((char *)&local_278);
    local_258._M_dataplus._M_p = (pointer)(stack->m_data).m_v.type_and_size;
    local_258._M_string_length = *(size_type *)&(stack->m_data).m_v.value;
    cali::Variant::to_string_abi_cxx11_((string *)&local_218,(Variant *)&local_258);
    std::__cxx11::string::append((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::append((char *)&local_278);
  }
  std::ofstream::ofstream(&local_218);
  local_218.m_level = 0;
  poVar1 = cali::Log::stream(&local_218);
  poVar1 = std::operator<<(poVar1,"Region stack mismatch: Trying to end \"");
  cali::Attribute::name_abi_cxx11_(&local_258,attr);
  poVar1 = std::operator<<(poVar1,(string *)&local_258);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)&local_278);
  poVar1 = std::operator<<(poVar1,"\n  Ceasing region tracking!");
  poVar1 = std::operator<<(poVar1,(string *)&local_238);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_258);
  std::ofstream::~ofstream(&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_278);
  return;
}

Assistant:

void log_stack_error(const Node* stack, const Attribute& attr)
{
    std::string stackstr;
    std::string helpstr;

    if (stack) {
        stackstr = " but current region is \"";
        stackstr.append(stack->data().to_string());
        stackstr.append("\".");
    } else
        stackstr = " but region stack is empty!";

    Log(0).stream() << "Region stack mismatch: Trying to end \"" << attr.name() << "\"" << stackstr
                    << "\n  Ceasing region tracking!" << helpstr << std::endl;
}